

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall QXmlStreamReaderPrivate::parseError(QXmlStreamReaderPrivate *this)

{
  int iVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  QArrayData *data;
  Data *pDVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long in_FS_OFFSET;
  QAnyStringView a;
  QAnyStringView a_00;
  QLatin1String local_d0;
  QString local_c0;
  QString local_a8;
  QString local_88;
  QString local_68;
  undefined8 local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->token == 0) {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char16_t *)0x0;
    local_68.d.size = 0;
    raiseError(this,PrematureEndOfDocumentError,&local_68);
    goto LAB_0039efd1;
  }
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  iVar1 = this->state_stack[this->tos];
  iVar11 = 0;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  if (this->token != 0x2b) {
    lVar7 = (long)QXmlStreamGrammar::action_index[iVar1];
    uVar8 = 0;
    iVar11 = 0;
    do {
      if (((long)(lVar7 + uVar8) < 0) ||
         (uVar8 != (uint)(int)QXmlStreamGrammar::action_check[lVar7 + uVar8])) {
        iVar9 = -(int)QXmlStreamGrammar::action_default[iVar1];
      }
      else {
        iVar9 = (int)QXmlStreamGrammar::action_info[lVar7 + uVar8];
      }
      if ((0 < iVar9) && (iVar11 < 4 && QXmlStreamGrammar::spell[uVar8] != (char *)0x0)) {
        lVar10 = (long)iVar11;
        iVar11 = iVar11 + 1;
        *(int *)((long)&local_48 + lVar10 * 4) = (int)uVar8;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 0x39);
  }
  if (iVar11 < 4 && iVar11 != 0) {
    local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QCoreApplication::translate(&local_a8,"QXmlStream","\'%1\'","expected",-1);
    uVar8 = 0x4000000000000000;
    aVar2 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
            ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)
            (QXmlStreamGrammar::spell + (int)local_48))->m_data;
    if ((char *)aVar2.m_data != (char *)0x0) {
      uVar8 = 0xffffffffffffffff;
      do {
        lVar7 = uVar8 + 1;
        uVar8 = uVar8 + 1;
      } while (*(char *)((long)aVar2.m_data + lVar7) != '\0');
      uVar8 = uVar8 | 0x4000000000000000;
    }
    a.m_size = uVar8;
    a.field_0.m_data = aVar2.m_data;
    QString::arg_impl(&local_88,&local_a8,a,0,(QChar)0x20);
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (iVar11 == 2) {
      QCoreApplication::translate(&local_c0,"QXmlStream","%1 or \'%2\'","expected",-1);
      local_d0.m_data = QXmlStreamGrammar::spell[local_48._4_4_];
      if (local_d0.m_data == (char *)0x0) {
        local_d0.m_size = 0;
      }
      else {
        lVar7 = -1;
        do {
          local_d0.m_size = lVar7 + 1;
          lVar10 = lVar7 + 1;
          lVar7 = local_d0.m_size;
        } while (local_d0.m_data[lVar10] != '\0');
      }
      QString::arg<QString&,QLatin1String>(&local_a8,&local_c0,&local_88,&local_d0);
LAB_0039ee3b:
      pcVar6 = local_88.d.ptr;
      pDVar5 = local_88.d.d;
      qVar4 = local_a8.d.size;
      pDVar3 = local_a8.d.d;
      local_a8.d.d = local_88.d.d;
      local_88.d.d = pDVar3;
      local_88.d.ptr = local_a8.d.ptr;
      local_a8.d.ptr = pcVar6;
      local_a8.d.size = local_88.d.size;
      local_88.d.size = qVar4;
      if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
        }
      }
      if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else if (2 < iVar11) {
      uVar8 = 1;
      do {
        QCoreApplication::translate(&local_c0,"QXmlStream","%1, \'%2\'","expected",-1);
        local_d0.m_data = QXmlStreamGrammar::spell[*(int *)((long)&local_48 + uVar8 * 4)];
        if (local_d0.m_data == (char *)0x0) {
          local_d0.m_size = 0;
        }
        else {
          lVar7 = -1;
          do {
            local_d0.m_size = lVar7 + 1;
            lVar10 = lVar7 + 1;
            lVar7 = local_d0.m_size;
          } while (local_d0.m_data[lVar10] != '\0');
        }
        QString::arg<QString&,QLatin1String>(&local_a8,&local_c0,&local_88,&local_d0);
        pcVar6 = local_88.d.ptr;
        pDVar5 = local_88.d.d;
        qVar4 = local_a8.d.size;
        pDVar3 = local_a8.d.d;
        local_a8.d.d = local_88.d.d;
        local_88.d.d = pDVar3;
        local_88.d.ptr = local_a8.d.ptr;
        local_a8.d.ptr = pcVar6;
        local_a8.d.size = local_88.d.size;
        local_88.d.size = qVar4;
        if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
          }
        }
        if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != iVar11 - 1);
      QCoreApplication::translate(&local_c0,"QXmlStream","%1, or \'%2\'","expected",-1);
      local_d0.m_data =
           QXmlStreamGrammar::spell[*(int *)((long)&local_48 + (uVar8 & 0xffffffff) * 4)];
      if (local_d0.m_data == (char *)0x0) {
        local_d0.m_size = 0;
      }
      else {
        lVar7 = -1;
        do {
          local_d0.m_size = lVar7 + 1;
          lVar10 = lVar7 + 1;
          lVar7 = local_d0.m_size;
        } while (local_d0.m_data[lVar10] != '\0');
      }
      QString::arg<QString&,QLatin1String>(&local_a8,&local_c0,&local_88,&local_d0);
      goto LAB_0039ee3b;
    }
    QCoreApplication::translate
              (&local_c0,"QXmlStream","Expected %1, but got \'%2\'.",(char *)0x0,-1);
    local_d0.m_data = QXmlStreamGrammar::spell[this->token];
    if (local_d0.m_data == (char *)0x0) {
      local_d0.m_size = 0;
    }
    else {
      lVar7 = -1;
      do {
        local_d0.m_size = lVar7 + 1;
        lVar10 = lVar7 + 1;
        lVar7 = local_d0.m_size;
      } while (local_d0.m_data[lVar10] != '\0');
    }
    QString::arg<QString&,QLatin1String>(&local_a8,&local_c0,&local_88,&local_d0);
    pcVar6 = local_68.d.ptr;
    pDVar5 = local_68.d.d;
    qVar4 = local_a8.d.size;
    pDVar3 = local_a8.d.d;
    local_a8.d.d = local_68.d.d;
    local_68.d.d = pDVar3;
    local_68.d.ptr = local_a8.d.ptr;
    local_a8.d.ptr = pcVar6;
    local_a8.d.size = local_68.d.size;
    local_68.d.size = qVar4;
    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      data = &(local_88.d.d)->super_QArrayData;
joined_r0x0039ec7f:
      if (iVar1 == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  else {
    QCoreApplication::translate(&local_a8,"QXmlStream","Unexpected \'%1\'.",(char *)0x0,-1);
    uVar8 = 0x4000000000000000;
    aVar2 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
            ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)
            (QXmlStreamGrammar::spell + this->token))->m_data;
    if ((char *)aVar2.m_data != (char *)0x0) {
      uVar8 = 0xffffffffffffffff;
      do {
        lVar7 = uVar8 + 1;
        uVar8 = uVar8 + 1;
      } while (*(char *)((long)aVar2.m_data + lVar7) != '\0');
      uVar8 = uVar8 | 0x4000000000000000;
    }
    a_00.m_size = uVar8;
    a_00.field_0.m_data = aVar2.m_data;
    QString::arg_impl(&local_88,&local_a8,a_00,0,(QChar)0x20);
    pcVar6 = local_68.d.ptr;
    pDVar5 = local_68.d.d;
    qVar4 = local_88.d.size;
    pDVar3 = local_88.d.d;
    local_88.d.d = local_68.d.d;
    local_68.d.d = pDVar3;
    local_68.d.ptr = local_88.d.ptr;
    local_88.d.ptr = pcVar6;
    local_88.d.size = local_68.d.size;
    local_68.d.size = qVar4;
    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
      }
    }
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      data = &(local_a8.d.d)->super_QArrayData;
      goto joined_r0x0039ec7f;
    }
  }
  this->error = NotWellFormedError;
  QString::operator=(&this->errorString,&local_68);
  this->type = Invalid;
LAB_0039efd1:
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::parseError()
{

    if (token == EOF_SYMBOL) {
        raiseError(QXmlStreamReader::PrematureEndOfDocumentError);
        return;
    }
    const int nmax = 4;
    QString error_message;
    int ers = state_stack[tos];
    int nexpected = 0;
    int expected[nmax];
    if (token != XML_ERROR)
        for (int tk = 0; tk < TERMINAL_COUNT; ++tk) {
            int k = t_action(ers, tk);
            if (k <= 0)
                continue;
            if (spell[tk]) {
                if (nexpected < nmax)
                    expected[nexpected++] = tk;
            }
        }

    if (nexpected && nexpected < nmax) {
        //: '<first option>'
        QString exp_str = QXmlStream::tr("'%1'", "expected")
                .arg(QLatin1StringView(spell[expected[0]]));
        if (nexpected == 2) {
            //: <first option>, '<second option>'
            exp_str = QXmlStream::tr("%1 or '%2'", "expected")
                    .arg(exp_str, QLatin1StringView(spell[expected[1]]));
        } else if (nexpected > 2) {
            int s = 1;
            for (; s < nexpected - 1; ++s) {
                //: <options so far>, '<next option>'
                exp_str = QXmlStream::tr("%1, '%2'", "expected")
                        .arg(exp_str, QLatin1StringView(spell[expected[s]]));
            }
            //: <options so far>, or '<final option>'
            exp_str = QXmlStream::tr("%1, or '%2'", "expected")
                    .arg(exp_str, QLatin1StringView(spell[expected[s]]));
        }
        error_message = QXmlStream::tr("Expected %1, but got '%2'.")
                .arg(exp_str, QLatin1StringView(spell[token]));
    } else {
        error_message = QXmlStream::tr("Unexpected '%1'.").arg(QLatin1StringView(spell[token]));
    }

    raiseWellFormedError(error_message);
}